

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::
int_writer<long_long,_fmt::v6::basic_format_specs<char>_>::on_num
          (int_writer<long_long,_fmt::v6::basic_format_specs<char>_> *this)

{
  char *pcVar1;
  char cVar2;
  ulong uVar3;
  long lVar4;
  num_writer f;
  char cVar5;
  int iVar6;
  int iVar7;
  _Alloc_hider _Var8;
  uint uVar9;
  int iVar10;
  int num_digits;
  string_view prefix;
  string groups;
  undefined4 uStack_4c;
  undefined7 uStack_3f;
  string local_38;
  
  grouping_impl<char>(&local_38,(locale_ref)(this->writer->locale_).locale_);
  if (local_38._M_string_length == 0) {
    on_dec(this);
    goto LAB_00124640;
  }
  cVar5 = thousands_sep_impl<char>((locale_ref)(this->writer->locale_).locale_);
  if (cVar5 == '\0') {
    on_dec(this);
    goto LAB_00124640;
  }
  uVar3 = this->abs_value;
  lVar4 = 0x3f;
  if ((uVar3 | 1) != 0) {
    for (; (uVar3 | 1) >> lVar4 == 0; lVar4 = lVar4 + -1) {
    }
  }
  uVar9 = ((uint)lVar4 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  iVar10 = (uVar9 + 1) -
           (uint)(uVar3 < *(ulong *)(basic_data<void>::zero_or_powers_of_10_64 + (ulong)uVar9 * 8));
  pcVar1 = local_38._M_dataplus._M_p + local_38._M_string_length;
  _Var8._M_p = local_38._M_dataplus._M_p;
  iVar6 = iVar10;
  if (local_38._M_string_length == 0) {
LAB_001245e8:
    num_digits = iVar10;
    iVar7 = iVar6;
    if (_Var8._M_p == pcVar1) goto LAB_001245f2;
  }
  else {
    num_digits = iVar10 + (int)local_38._M_string_length;
    do {
      cVar2 = *_Var8._M_p;
      iVar7 = iVar6 - cVar2;
      if ((iVar7 == 0 || iVar6 < cVar2) || ((byte)(cVar2 + 0x81U) < 0x82)) goto LAB_001245e8;
      iVar10 = iVar10 + 1;
      _Var8._M_p = _Var8._M_p + 1;
      local_38._M_string_length = local_38._M_string_length - 1;
      iVar6 = iVar7;
    } while (local_38._M_string_length != 0);
LAB_001245f2:
    num_digits = (iVar7 + -1) / (int)pcVar1[-1] + num_digits;
  }
  f._12_4_ = uStack_4c;
  f.size = num_digits;
  f._25_7_ = uStack_3f;
  f.sep = cVar5;
  f.abs_value = uVar3;
  f.groups = &local_38;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  basic_writer<fmt::v6::buffer_range<char>>::
  write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<long_long,fmt::v6::basic_format_specs<char>>::num_writer>
            ((basic_writer<fmt::v6::buffer_range<char>> *)this->writer,num_digits,prefix,
             *this->specs,f);
LAB_00124640:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = thousands_sep<char_type>(writer.locale_);
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, sep});
    }